

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::DisplayComponents(cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  uint uVar1;
  pointer pcVar2;
  uint *puVar3;
  FILE *__stream;
  ulong uVar4;
  string *psVar5;
  uint *puVar6;
  ulong uVar7;
  
  fwrite("The strongly connected components are:\n",0x27,1,_stderr);
  uVar4 = ((long)(ccg->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar7 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar7 = 0;
  }
  for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    pcVar2 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fprintf(_stderr,"Component (%d):\n",uVar4 & 0xffffffff);
    puVar3 = *(uint **)((long)&pcVar2[uVar4].super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (puVar6 = *(uint **)&pcVar2[uVar4].super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl;
        __stream = _stderr, puVar6 != puVar3; puVar6 = puVar6 + 1) {
      uVar1 = *puVar6;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar1]);
      fprintf(__stream,"  contains target %d [%s]\n",(ulong)uVar1,(psVar5->_M_dataplus)._M_p);
    }
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayComponents(
  cmComputeComponentGraph const& ccg)
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = ccg.GetComponents();
  int n = static_cast<int>(components.size());
  for (int c = 0; c < n; ++c) {
    NodeList const& nl = components[c];
    fprintf(stderr, "Component (%d):\n", c);
    for (int i : nl) {
      fprintf(stderr, "  contains target %d [%s]\n", i,
              this->Targets[i]->GetName().c_str());
    }
  }
  fprintf(stderr, "\n");
}